

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_mask_util.cc
# Opt level: O3

bool __thiscall
google::protobuf::util::FieldMaskUtil::GetFieldDescriptors
          (FieldMaskUtil *this,Descriptor *descriptor,string_view path,
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          *field_descriptors)

{
  byte bVar1;
  iterator __position;
  string_view *psVar2;
  Nonnull<const_char_*> failure_msg;
  vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
  *this_00;
  string_view *psVar3;
  bool bVar4;
  FieldDescriptor *field;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  parts;
  FieldDescriptor *local_68;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_60;
  Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_48;
  
  this_00 = (vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
             *)path._M_str;
  local_48.text_._M_str = (char *)path._M_len;
  if ((this_00 !=
       (vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
        *)0x0) && (*(long *)(this_00 + 8) != *(long *)this_00)) {
    *(long *)(this_00 + 8) = *(long *)this_00;
  }
  local_48.delimiter_.c_ = '.';
  local_48.text_._M_len = (size_t)descriptor;
  absl::lts_20250127::strings_internal::
  Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::
  ConvertToContainer<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
  ::operator()(&local_60,
               (ConvertToContainer<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
                *)&local_68,&local_48);
  bVar4 = local_60.
          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          local_60.
          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish;
  psVar2 = local_60.
           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (this != (FieldMaskUtil *)0x0 && !bVar4) {
    while( true ) {
      psVar3 = psVar2 + 1;
      local_68 = Descriptor::FindFieldByName((Descriptor *)this,*psVar2);
      if (local_68 == (FieldDescriptor *)0x0) {
        bVar4 = false;
        goto LAB_00fc0ca2;
      }
      if (this_00 !=
          (vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
           *)0x0) {
        __position._M_current = *(FieldDescriptor ***)(this_00 + 8);
        if (__position._M_current == *(FieldDescriptor ***)(this_00 + 0x10)) {
          std::
          vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
          ::_M_realloc_insert<google::protobuf::FieldDescriptor_const*const&>
                    (this_00,__position,&local_68);
        }
        else {
          *__position._M_current = local_68;
          *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
        }
      }
      bVar1 = local_68->field_0x1;
      bVar4 = (bool)((bVar1 & 0x20) >> 5);
      if (0xbf < bVar1 != bVar4) {
        failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                                (bVar4,0xbf < bVar1,
                                 "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_48,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,0xb54,failure_msg);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_48);
      }
      if (((bVar1 & 0x20) != 0) ||
         (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)local_68->type_ * 4) != 10)) break;
      this = (FieldMaskUtil *)FieldDescriptor::message_type(local_68);
      bVar4 = psVar3 == local_60.
                        super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
      if ((bVar4) || (psVar2 = psVar3, (Descriptor *)this == (Descriptor *)0x0)) goto LAB_00fc0ca2;
    }
    bVar4 = psVar3 == local_60.
                      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
  }
LAB_00fc0ca2:
  if (local_60.
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (string_view *)0x0) {
    operator_delete(local_60.
                    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_60.
                          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.
                          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return bVar4;
}

Assistant:

bool FieldMaskUtil::GetFieldDescriptors(
    const Descriptor* descriptor, absl::string_view path,
    std::vector<const FieldDescriptor*>* field_descriptors) {
  if (field_descriptors != nullptr) {
    field_descriptors->clear();
  }
  std::vector<absl::string_view> parts = absl::StrSplit(path, '.');
  for (absl::string_view field_name : parts) {
    if (descriptor == nullptr) {
      return false;
    }
    const FieldDescriptor* field = descriptor->FindFieldByName(field_name);
    if (field == nullptr) {
      return false;
    }
    if (field_descriptors != nullptr) {
      field_descriptors->push_back(field);
    }
    if (!field->is_repeated() &&
        field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      descriptor = field->message_type();
    } else {
      descriptor = nullptr;
    }
  }
  return true;
}